

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.h
# Opt level: O3

void __thiscall Quadratic::Quadratic(Quadratic *this,HighsLp *lp_,ICrashOptions *options_)

{
  double dVar1;
  undefined8 uVar2;
  bool *pbVar3;
  bool *pbVar4;
  HighsInt *pHVar5;
  _func_void_HighsLogType_char_ptr_void_ptr *p_Var6;
  void *pvVar7;
  bool bVar8;
  undefined3 uVar9;
  ICrashStrategy IVar10;
  
  HighsLp::HighsLp(&this->lp,lp_);
  bVar8 = options_->dualize;
  uVar9 = *(undefined3 *)&options_->field_0x1;
  IVar10 = options_->strategy;
  dVar1 = options_->starting_weight;
  uVar2 = *(undefined8 *)((long)&options_->iterations + 2);
  *(undefined8 *)((long)&(this->options).starting_weight + 2) =
       *(undefined8 *)((long)&options_->starting_weight + 2);
  *(undefined8 *)((long)&(this->options).iterations + 2) = uVar2;
  (this->options).dualize = bVar8;
  *(undefined3 *)&(this->options).field_0x1 = uVar9;
  (this->options).strategy = IVar10;
  (this->options).starting_weight = dVar1;
  pbVar3 = (options_->log_options).output_flag;
  pbVar4 = (options_->log_options).log_to_console;
  pHVar5 = (options_->log_options).log_dev_level;
  p_Var6 = (options_->log_options).user_log_callback;
  pvVar7 = (options_->log_options).user_log_callback_data;
  (this->options).log_options.log_stream = (options_->log_options).log_stream;
  (this->options).log_options.output_flag = pbVar3;
  (this->options).log_options.log_to_console = pbVar4;
  (this->options).log_options.log_dev_level = pHVar5;
  (this->options).log_options.user_log_callback = p_Var6;
  (this->options).log_options.user_log_callback_data = pvVar7;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(&(this->options).log_options.user_callback,&(options_->log_options).user_callback);
  (this->options).log_options.user_callback_active = (options_->log_options).user_callback_active;
  (this->options).log_options.user_callback_data = (options_->log_options).user_callback_data;
  (this->details).
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->details).
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->details).
           super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->details).
           super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  memset(&(this->xk).col_value,0,0xb0);
  return;
}

Assistant:

Quadratic(HighsLp lp_, ICrashOptions options_)
      : lp(lp_),
        options(options_),
        lp_objective(0.0),
        quadratic_objective(0.0),
        residual_norm_2(0.0),
        mu(0.0) {}